

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.c
# Opt level: O0

_Bool gb_timer_should_increment_tima(Timer *timer,MemoryBankController *mc)

{
  byte b;
  _Bool _Var1;
  _Bool local_39;
  int local_28;
  _Bool value;
  int n;
  uint8_t clock_select;
  uint8_t timer_control;
  MemoryBankController *mc_local;
  Timer *timer_local;
  
  b = (*mc->read)(mc,0xff07);
  switch(b & 3) {
  case 0:
    local_28 = 9;
    break;
  case 1:
    local_28 = 3;
    break;
  case 2:
    local_28 = 5;
    break;
  case 3:
    local_28 = 7;
    break;
  default:
    local_28 = 9;
  }
  _Var1 = test_bit_16bit(mc->div_register,local_28);
  local_39 = false;
  if (_Var1) {
    local_39 = test_bit_8bit(b,2);
  }
  if ((local_39 == false) && ((timer->prev_delay & 1U) != 0)) {
    timer->prev_delay = false;
    timer_local._7_1_ = true;
  }
  else {
    timer->prev_delay = local_39;
    timer_local._7_1_ = false;
  }
  return timer_local._7_1_;
}

Assistant:

bool gb_timer_should_increment_tima(Timer* timer, MemoryBankController* mc) {

    const uint8_t timer_control = mc->read(mc, TAC);
    const uint8_t clock_select = (uint8_t) (timer_control & 0x03u);
    int n = 0;

    switch(clock_select) {
        case 0:
            n = 9;
            break;
        case 1:
            n = 3;
            break;
        case 2:
            n = 5;
            break;
        case 3:
            n = 7;
            break;
        default:
            n = 9;
            break;
    }

    bool value = test_bit_16bit(mc->div_register, n) && test_bit_8bit(timer_control, 2);
    if(!value && timer->prev_delay) {
        timer->prev_delay = value;
        return true;
    }

    timer->prev_delay = value;
    return false;
}